

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_0::Texture2DMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Texture2DMipmapTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat TVar1;
  CoordType CVar2;
  int iVar3;
  CoordType CVar4;
  TestLog *pTVar5;
  ulong uVar6;
  TestStatus *pTVar7;
  deUint32 width;
  deUint32 height;
  deUint32 dVar8;
  deUint32 dVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  TextureFormat TVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Surface *pSVar14;
  uint uVar15;
  ulong uVar16;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  int iVar17;
  int iVar18;
  int iVar19;
  byte bVar20;
  int iVar21;
  long lVar22;
  void *pvVar23;
  int cellNdx;
  uint cellNdx_00;
  long lVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  float *local_488;
  undefined1 local_480 [40];
  vector<float,_std::allocator<float>_> texCoord;
  undefined1 local_438 [40];
  undefined1 local_410 [40];
  ulong local_3e8;
  ulong local_3e0;
  Surface referenceFrame;
  Surface renderedFrame;
  undefined1 local_3a8 [40];
  Surface errorMask;
  LodPrecision lodPrec;
  Texture2DView local_358;
  PixelFormat local_348;
  TestStatus *local_330;
  long local_328;
  ulong local_320;
  undefined1 local_318 [24];
  undefined8 local_300;
  size_type sStack_2f8;
  BVec4 local_2f0;
  Vector<int,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [6];
  IVec4 formatBitDepth;
  undefined1 local_248 [32];
  int local_228;
  undefined1 auStack_224 [84];
  ios_base local_1d0 [268];
  undefined1 local_c4 [76];
  size_type sStack_78;
  size_type local_70;
  int aiStack_68 [2];
  int local_60;
  LodMode local_44;
  
  this_00 = &this->m_renderer;
  width = util::TextureRenderer::getRenderWidth(this_00);
  height = util::TextureRenderer::getRenderHeight(this_00);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams((ReferenceParams *)local_c4,TEXTURETYPE_2D)
  ;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CVar2 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
  tcu::Surface::Surface(&renderedFrame,width,height);
  dVar8 = width + 3;
  if (-1 < (int)width) {
    dVar8 = width;
  }
  dVar9 = height + 3;
  if (-1 < (int)height) {
    dVar9 = height;
  }
  util::createSampler((Sampler *)local_248,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  local_60 = local_228;
  local_70 = local_248._16_8_;
  aiStack_68[0] = local_248._24_4_;
  aiStack_68[1] = local_248._28_4_;
  local_c4._68_8_ = local_248._0_8_;
  sStack_78 = local_248._8_8_;
  TVar13 = ::vk::mapVkFormat((this->m_testParameters).super_Texture2DTestCaseParameters.
                             super_TextureCommonTestCaseParameters.format);
  local_c4._4_4_ = glu::TextureTestUtil::getSamplerType(TVar13);
  local_c4._8_4_ = (uint)(CVar2 == COORDTYPE_PROJECTED) + (uint)(CVar2 == COORDTYPE_BASIC_BIAS) * 2;
  local_44 = LODMODE_EXACT;
  local_330 = __return_storage_ptr__;
  if (texture::(anonymous_namespace)::Texture2DMipmapTestInstance::iterate()::s_projections == '\0')
  {
    _GLOBAL__N_1::Texture2DMipmapTestInstance::iterate();
  }
  iVar21 = (int)dVar8 >> 2;
  iVar3 = (int)dVar9 >> 2;
  uVar15 = 0;
  lVar22 = 0;
  local_3e8 = (ulong)height;
  local_3e0 = (ulong)width;
  do {
    iVar10 = iVar3 * (int)lVar22;
    iVar17 = (int)local_3e8 - iVar10;
    if (lVar22 != 3) {
      iVar17 = iVar3;
    }
    iVar19 = 0;
    uVar16 = local_3e0 & 0xffffffff;
    cellNdx_00 = uVar15;
    for (lVar24 = 0; uVar6 = local_3e0, uVar25 = local_3e8, lVar24 != 0x40; lVar24 = lVar24 + 0x10)
    {
      iVar18 = iVar21;
      if (lVar24 == 0x30) {
        iVar18 = (int)uVar16;
      }
      CVar4 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_007e7cb7:
        getBasicTexCoord2D(&texCoord,cellNdx_00);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,cellNdx_00);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_007e7cb7;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_c4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar24);
        local_c4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar24 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_c4._28_4_ = iterate::s_bias[cellNdx_00 & 7];
      }
      util::TextureRenderer::setViewport
                (this_00,(float)iVar19,(float)iVar10,(float)iVar18,(float)iVar17);
      cellNdx_00 = cellNdx_00 + 1;
      uVar16 = (ulong)(uint)((int)uVar16 - iVar21);
      iVar19 = iVar19 + iVar21;
      util::TextureRenderer::renderQuad
                (this_00,&renderedFrame,0,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_c4);
    }
    lVar22 = lVar22 + 1;
    uVar15 = uVar15 + 4;
  } while (lVar22 != 4);
  local_248._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)local_248);
  local_348.redBits = formatBitDepth.m_data[0];
  local_348.greenBits = formatBitDepth.m_data[1];
  local_348.blueBits = formatBitDepth.m_data[2];
  local_348.alphaBits = formatBitDepth.m_data[3];
  iVar17 = -1 - (uint)(((this->m_testParameters).super_Texture2DTestCaseParameters.
                        super_TextureCommonTestCaseParameters.minFilter - NEAREST_MIPMAP_LINEAR &
                       0xfffffffd) == 0);
  tcu::Surface::Surface(&referenceFrame,(int)uVar6,(int)uVar25);
  tcu::Surface::Surface(&errorMask,(int)uVar6,(int)uVar25);
  local_300._0_4_ = 0.0;
  local_300._4_4_ = 0.0;
  sStack_2f8._0_4_ = 0.0;
  sStack_2f8._4_4_ = 0.0;
  local_2f0.m_data[0] = true;
  local_2f0.m_data[1] = true;
  local_2f0.m_data[2] = true;
  local_2f0.m_data[3] = true;
  lodPrec.rule = RULE_VULKAN;
  lodPrec.derivateBits = 0x16;
  lodPrec.lodBits = 0x10;
  local_318._0_4_ = 0x14;
  local_318._4_4_ = 0x14;
  local_318._8_4_ = 0;
  local_318._12_4_ = 0x10;
  local_318._16_4_ = 0x10;
  local_318._20_4_ = 0;
  res.m_data[0] = -(uint)(0 < iVar17 + local_348.redBits) & iVar17 + local_348.redBits;
  res.m_data[1] = -(uint)(0 < iVar17 + local_348.greenBits) & iVar17 + local_348.greenBits;
  res.m_data[3] = -(uint)(0 < iVar17 + local_348.alphaBits) & iVar17 + local_348.alphaBits;
  res.m_data[2] = -(uint)(0 < iVar17 + local_348.blueBits) & iVar17 + local_348.blueBits;
  tcu::computeFixedPointThreshold((tcu *)local_248,&res);
  local_300._0_4_ = (float)local_248._0_4_;
  local_300._4_4_ = (float)local_248._4_4_;
  sStack_2f8 = local_248._8_8_;
  auVar26._0_4_ = -(uint)(0 < local_348.redBits);
  auVar26._4_4_ = -(uint)(0 < local_348.greenBits);
  auVar26._8_4_ = -(uint)(0 < local_348.blueBits);
  auVar26._12_4_ = -(uint)(0 < local_348.alphaBits);
  uVar15 = movmskps((int)&local_348,auVar26);
  bVar20 = (byte)uVar15;
  local_2f0.m_data =
       (bool  [4])
       (uVar15 & 1 | (uint)((bVar20 & 2) >> 1) << 8 | (uint)((bVar20 & 4) >> 2) << 0x10 |
       (uint)(bVar20 >> 3) << 0x18);
  lodPrec.derivateBits = 10;
  lodPrec.lodBits = (uint)(CVar2 != COORDTYPE_PROJECTED) * 2 + 6;
  uVar15 = 0;
  lVar22 = 0;
  iVar17 = 0;
  do {
    uVar16 = (ulong)uVar15;
    local_488 = iterate::s_bias + (uVar15 & 7);
    iVar19 = iVar3 * (int)lVar22;
    iVar10 = (int)local_3e8 - iVar19;
    if (lVar22 != 3) {
      iVar10 = iVar3;
    }
    lVar24 = 0;
    iVar18 = 0;
    uVar25 = local_3e0 & 0xffffffff;
    local_328 = lVar22;
    local_320 = uVar16;
    do {
      iVar12 = iVar21;
      if (lVar24 == 0x30) {
        iVar12 = (int)uVar25;
      }
      CVar4 = (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType;
      cellNdx = (int)uVar16;
      if (CVar4 < COORDTYPE_AFFINE) {
LAB_007e7fc4:
        getBasicTexCoord2D(&texCoord,cellNdx);
      }
      else if (CVar4 == COORDTYPE_AFFINE) {
        getAffineTexCoord2D(&texCoord,cellNdx);
      }
      else if (CVar4 == COORDTYPE_PROJECTED) goto LAB_007e7fc4;
      if (CVar2 == COORDTYPE_PROJECTED) {
        local_c4._12_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar24);
        local_c4._20_8_ = *(undefined8 *)((long)iterate::s_projections[0].m_data + lVar24 + 8);
      }
      else if (CVar2 == COORDTYPE_BASIC_BIAS) {
        local_c4._28_4_ = *local_488;
      }
      tcu::SurfaceAccess::SurfaceAccess
                ((SurfaceAccess *)local_248,&referenceFrame,&local_348,iVar18,iVar19,iVar12,iVar10);
      iVar11 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      res.m_data[0] = *(int *)(CONCAT44(extraout_var,iVar11) + 0x40);
      res.m_data._8_8_ = *(undefined8 *)(CONCAT44(extraout_var,iVar11) + 0x48);
      glu::TextureTestUtil::sampleTexture
                ((SurfaceAccess *)local_248,(Texture2DView *)&res,
                 texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start,(ReferenceParams *)local_c4);
      local_480._0_4_ = RGBA;
      local_480._4_4_ = UNORM_INT8;
      pvVar23 = (void *)renderedFrame.m_pixels.m_cap;
      if (renderedFrame.m_pixels.m_cap != 0) {
        pvVar23 = renderedFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&res,(TextureFormat *)local_480,renderedFrame.m_width,
                 renderedFrame.m_height,1,pvVar23);
      tcu::getSubregion((PixelBufferAccess *)local_248,(PixelBufferAccess *)&res,iVar18,iVar19,
                        iVar12,iVar10);
      local_438._0_4_ = RGBA;
      local_438._4_4_ = UNORM_INT8;
      pvVar23 = (void *)referenceFrame.m_pixels.m_cap;
      if (referenceFrame.m_pixels.m_cap != 0) {
        pvVar23 = referenceFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_410,(TextureFormat *)local_438,referenceFrame.m_width,
                 referenceFrame.m_height,1,pvVar23);
      tcu::getSubregion((PixelBufferAccess *)local_480,(PixelBufferAccess *)local_410,iVar18,iVar19,
                        iVar12,iVar10);
      local_358.m_numLevels = 8;
      local_358._4_4_ = 3;
      pvVar23 = (void *)errorMask.m_pixels.m_cap;
      if (errorMask.m_pixels.m_cap != 0) {
        pvVar23 = errorMask.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_3a8,(TextureFormat *)&local_358,errorMask.m_width,
                 errorMask.m_height,1,pvVar23);
      tcu::getSubregion((PixelBufferAccess *)local_438,(PixelBufferAccess *)local_3a8,iVar18,iVar19,
                        iVar12,iVar10);
      iVar12 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
      local_358.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar12) + 0x48);
      local_358.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar12) + 0x40);
      iVar12 = glu::TextureTestUtil::computeTextureLookupDiff
                         ((ConstPixelBufferAccess *)local_248,(ConstPixelBufferAccess *)local_480,
                          (PixelBufferAccess *)local_438,&local_358,
                          texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ReferenceParams *)local_c4,
                          (LookupPrecision *)local_318,&lodPrec,
                          ((this->super_TestInstance).m_context)->m_testCtx->m_watchDog);
      iVar17 = iVar17 + iVar12;
      uVar25 = (ulong)(uint)((int)uVar25 - iVar21);
      iVar18 = iVar18 + iVar21;
      lVar24 = lVar24 + 0x10;
      uVar16 = (ulong)(cellNdx + 1);
      local_488 = local_488 + 1;
    } while (lVar24 != 0x40);
    lVar22 = local_328 + 1;
    uVar15 = (int)local_320 + 4;
    if (lVar22 == 4) {
      if (0 < iVar17) {
        local_248._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        this_01 = (ostringstream *)(local_248 + 8);
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,"ERROR: Image verification failed, found ",0x28);
        std::ostream::operator<<(this_01,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01," invalid pixels!",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_248,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base(local_1d0);
      }
      pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
      local_480._0_8_ = (long)local_480 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Result","");
      local_410._0_8_ = (long)local_410 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Verification result","");
      tcu::LogImageSet::LogImageSet((LogImageSet *)&res,(string *)local_480,(string *)local_410);
      tcu::TestLog::startImageSet
                (pTVar5,(char *)CONCAT44(res.m_data[1],res.m_data[0]),local_2c8._M_p);
      local_438._0_8_ = (long)local_438 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Rendered","");
      TVar13 = (TextureFormat)((long)local_3a8 + 0x10);
      local_3a8._0_8_ = TVar13;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Rendered image","");
      pSVar14 = &renderedFrame;
      tcu::LogImage::LogImage
                ((LogImage *)local_248,(string *)local_438,(string *)local_3a8,pSVar14,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_248,(int)pTVar5,__buf,(size_t)pSVar14);
      if ((undefined1 *)CONCAT44(auStack_224._0_4_,local_228) != auStack_224 + 0xc) {
        operator_delete((undefined1 *)CONCAT44(auStack_224._0_4_,local_228),
                        CONCAT44(auStack_224._16_4_,auStack_224._12_4_) + 1);
      }
      TVar1 = (TextureFormat)((long)local_248 + 0x10);
      if ((TextureFormat)local_248._0_8_ != TVar1) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      if ((TextureFormat)local_3a8._0_8_ != TVar13) {
        operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
      }
      if (local_438._0_8_ != (long)local_438 + 0x10) {
        operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_p != local_2b8) {
        operator_delete(local_2c8._M_p,local_2b8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_2d8) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(res.m_data[1],res.m_data[0]),local_2d8._M_allocated_capacity + 1
                       );
      }
      if (local_410._0_8_ != (long)local_410 + 0x10) {
        operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
      }
      if (local_480._0_8_ != (long)local_480 + 0x10) {
        operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
      }
      if (0 < iVar17) {
        pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
        local_480._0_8_ = (long)local_480 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_480,"Reference","");
        local_410._0_8_ = (long)local_410 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_410,"Ideal reference","");
        pSVar14 = &referenceFrame;
        tcu::LogImage::LogImage
                  ((LogImage *)local_248,(string *)local_480,(string *)local_410,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        iVar21 = (int)pTVar5;
        tcu::LogImage::write((LogImage *)local_248,iVar21,__buf_00,(size_t)pSVar14);
        local_438._0_8_ = (long)local_438 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"ErrorMask","");
        local_3a8._0_8_ = TVar13;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"Error mask","");
        pSVar14 = &errorMask;
        tcu::LogImage::LogImage
                  ((LogImage *)&res,(string *)local_438,(string *)local_3a8,pSVar14,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&res,iVar21,__buf_01,(size_t)pSVar14);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_p != local_2b8) {
          operator_delete(local_2c8._M_p,local_2b8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(res.m_data[1],res.m_data[0]) != &local_2d8) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(res.m_data[1],res.m_data[0]),
                          local_2d8._M_allocated_capacity + 1);
        }
        if ((TextureFormat)local_3a8._0_8_ != TVar13) {
          operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
        }
        if (local_438._0_8_ != (long)local_438 + 0x10) {
          operator_delete((void *)local_438._0_8_,local_438._16_8_ + 1);
        }
        if ((undefined1 *)CONCAT44(auStack_224._0_4_,local_228) != auStack_224 + 0xc) {
          operator_delete((undefined1 *)CONCAT44(auStack_224._0_4_,local_228),
                          CONCAT44(auStack_224._16_4_,auStack_224._12_4_) + 1);
        }
        if ((TextureFormat)local_248._0_8_ != TVar1) {
          operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
        }
        if (local_410._0_8_ != (long)local_410 + 0x10) {
          operator_delete((void *)local_410._0_8_,local_410._16_8_ + 1);
        }
        if (local_480._0_8_ != (long)local_480 + 0x10) {
          operator_delete((void *)local_480._0_8_,local_480._16_8_ + 1);
        }
      }
      tcu::TestLog::endImageSet(((this->super_TestInstance).m_context)->m_testCtx->m_log);
      pTVar7 = local_330;
      local_248._0_8_ = TVar1;
      if (iVar17 == 0) {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"pass","");
        pTVar7->m_code = QP_TEST_RESULT_PASS;
        (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar7->m_description,local_248._0_8_,
                   local_248._8_8_ + local_248._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"fail","");
        pTVar7->m_code = QP_TEST_RESULT_FAIL;
        (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pTVar7->m_description,local_248._0_8_,
                   local_248._8_8_ + local_248._0_8_);
      }
      if ((TextureFormat)local_248._0_8_ != TVar1) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
      tcu::Surface::~Surface(&errorMask);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return pTVar7;
    }
  } while( true );
}

Assistant:

tcu::TestStatus Texture2DMipmapTestInstance::iterate (void)
{
	const Sampler::FilterMode	magFilter		= Sampler::NEAREST;
	const int					viewportWidth	= m_renderer.getRenderWidth();
	const int					viewportHeight	= m_renderer.getRenderHeight();

	ReferenceParams				refParams		(TEXTURETYPE_2D);
	vector<float>				texCoord;

	const bool					isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool					useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	tcu::Surface				renderedFrame	(viewportWidth, viewportHeight);

	// Viewport is divided into 4x4 grid.
	const int					gridWidth		= 4;
	const int					gridHeight		= 4;
	const int					cellWidth		= viewportWidth / gridWidth;
	const int					cellHeight		= viewportHeight / gridHeight;

	// Sampling parameters.
	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 2.0f),
		Vec4(0.8f, 1.0f, 1.7f, 0.6f),
		Vec4(1.2f, 1.0f, 1.7f, 1.5f)
	};

	// Render cells.
	for (int gridY = 0; gridY < gridHeight; gridY++)
	{
		for (int gridX = 0; gridX < gridWidth; gridX++)
		{
			const int	curX		= cellWidth*gridX;
			const int	curY		= cellHeight*gridY;
			const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
			const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
			const int	cellNdx		= gridY*gridWidth + gridX;

			// Compute texcoord.
			switch (m_testParameters.coordType)
			{
				case COORDTYPE_BASIC_BIAS:	// Fall-through.
				case COORDTYPE_PROJECTED:
				case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
				case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
				default:					DE_ASSERT(DE_FALSE);
			}

			if (isProjected)
				refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

			if (useLodBias)
				refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

			m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
			m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
		}
	}

	// Compare and log.
	{
		const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		const bool				isTrilinear		= m_testParameters.minFilter == Sampler::NEAREST_MIPMAP_LINEAR || m_testParameters.minFilter == Sampler::LINEAR_MIPMAP_LINEAR;
		tcu::Surface			referenceFrame	(viewportWidth, viewportHeight);
		tcu::Surface			errorMask		(viewportWidth, viewportHeight);
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_VULKAN);
		int						numFailedPixels	= 0;

		lookupPrec.coordBits		= tcu::IVec3(20, 20, 0);
		lookupPrec.uvwBits			= tcu::IVec3(16, 16, 0); // Doesn't really matter since pixels are unicolored.
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat) - (isTrilinear ? 2 : 1), tcu::IVec4(0)));
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 6 : 8;

		for (int gridY = 0; gridY < gridHeight; gridY++)
		{
			for (int gridX = 0; gridX < gridWidth; gridX++)
			{
				const int	curX		= cellWidth*gridX;
				const int	curY		= cellHeight*gridY;
				const int	curW		= gridX+1 == gridWidth ? (viewportWidth-curX) : cellWidth;
				const int	curH		= gridY+1 == gridHeight ? (viewportHeight-curY) : cellHeight;
				const int	cellNdx		= gridY*gridWidth + gridX;

				// Compute texcoord.
				switch (m_testParameters.coordType)
				{
					case COORDTYPE_BASIC_BIAS:	// Fall-through.
					case COORDTYPE_PROJECTED:
					case COORDTYPE_BASIC:		getBasicTexCoord2D	(texCoord, cellNdx);	break;
					case COORDTYPE_AFFINE:		getAffineTexCoord2D	(texCoord, cellNdx);	break;
					default:					DE_ASSERT(DE_FALSE);
				}

				if (isProjected)
					refParams.w = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];

				if (useLodBias)
					refParams.bias = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];

				// Render ideal result
				sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat, curX, curY, curW, curH),
							  m_texture->getTexture(), &texCoord[0], refParams);

				// Compare this cell
				numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
															tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
															m_texture->getTexture(), &texCoord[0], refParams,
															lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
			}
		}

		if (numFailedPixels > 0)
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}